

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

string * __thiscall LUPMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,LUPMatrix *this)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"L: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)local_190,&this->l_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)local_190,"U: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator<<((ostream *)local_190,&this->u_);
  poVar1 = std::operator<<((ostream *)local_190,"Row Permutation: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)local_190,&this->row_permutation_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)local_190,"Column Permutation: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator<<((ostream *)local_190,&this->column_permutation_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string LUPMatrix::ToString() const {
  std::ostringstream out;
  out << "L: " << std::endl;
  out << l_ << std::endl;
  out << "U: " << std::endl;
  out << u_;
  out << "Row Permutation: " << std::endl;
  out << row_permutation_ << std::endl;
  out << "Column Permutation: " << std::endl;
  out << column_permutation_;

  return out.str();
}